

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *fmt)

{
  byte *pbVar1;
  Hex<2UL> local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  pbVar1 = (fmt->begin).m_iter;
  if ((fmt->end).m_iter != pbVar1) {
    do {
      if (pbVar1 != (fmt->begin).m_iter) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      local_30.value = (deUint64)*pbVar1;
      Hex<2UL>::toStream(&local_30,str);
      pbVar1 = pbVar1 + 1;
    } while (pbVar1 != (fmt->end).m_iter);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}